

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.cpp
# Opt level: O1

SRes crnlib::LzmaEnc_CodeOneBlock
               (CLzmaEnc *p,Bool useLimits,UInt32 maxPackSize,UInt32 maxUnpackSize)

{
  byte bVar1;
  byte bVar2;
  UInt16 *pUVar3;
  bool bVar4;
  undefined8 uVar5;
  CRangeEnc *pCVar6;
  CRangeEnc *p_00;
  UInt16 (*paUVar7) [64];
  byte bVar8;
  UInt32 UVar9;
  UInt32 UVar10;
  SRes SVar11;
  undefined4 extraout_var;
  Byte *pBVar12;
  COptimal *pCVar13;
  UInt32 (*paUVar14) [272];
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  long lVar19;
  undefined1 *puVar20;
  UInt32 *pUVar21;
  COptimal *pCVar22;
  uint uVar23;
  CState *pCVar24;
  long lVar25;
  UInt32 m;
  uint uVar26;
  int iVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  int iVar31;
  uint uVar32;
  UInt32 *pUVar33;
  uint uVar34;
  Byte *pBVar35;
  long lVar36;
  ulong uVar37;
  uint uVar38;
  UInt32 *in_R9;
  UInt32 m_1;
  int iVar39;
  uint uVar40;
  ulong uVar41;
  Byte *pBVar42;
  UInt32 m_2;
  uint uVar43;
  uint uVar44;
  UInt32 UVar45;
  ulong uVar46;
  bool bVar47;
  bool bVar48;
  UInt32 numPairs;
  UInt32 numPairs_1;
  UInt32 repLens [4];
  UInt32 local_22c;
  ulong local_228;
  int local_220;
  uint local_21c;
  Byte *local_218;
  ulong local_210;
  ulong local_208;
  uint local_1fc;
  UInt32 *local_1f8;
  Byte *local_1f0;
  COptimal *local_1e8;
  UInt32 local_1dc;
  ulong local_1d8;
  UInt32 *local_1d0;
  ulong local_1c8;
  UInt16 (*local_1c0) [16];
  uint local_1b4;
  uint local_1b0;
  uint local_1ac;
  uint local_1a8;
  UInt32 UStack_1a4;
  UInt32 UStack_1a0;
  UInt32 UStack_19c;
  CRangeEnc *local_190;
  UInt32 *local_188;
  ulong local_180;
  UInt32 (*local_178) [272];
  ulong local_170;
  ulong local_168;
  UInt32 local_160;
  uint local_15c;
  ulong local_158;
  UInt16 (*local_150) [16];
  ulong local_148;
  ulong local_140;
  COptimal *local_138;
  UInt32 (*local_130) [272];
  ulong local_128;
  ulong local_120;
  ulong local_118;
  uint local_10c;
  uint local_108;
  uint local_104;
  int local_100;
  uint local_fc;
  uint local_f8;
  UInt32 local_f4;
  UInt32 local_f0;
  Bool local_ec;
  uint local_e8 [4];
  UInt32 *local_d8;
  UInt16 *local_d0;
  UInt16 *local_c8;
  ulong local_c0;
  UInt16 *local_b8;
  UInt32 (*local_b0) [128];
  UInt32 (*local_a8) [64];
  UInt16 *local_a0;
  UInt32 (*local_98) [272];
  UInt16 *local_90;
  UInt32 *local_88;
  UInt32 *local_80;
  UInt16 *local_78;
  UInt16 *local_70;
  ulong local_68;
  UInt16 *local_60;
  Byte *local_58;
  CLenPriceEnc *local_50;
  UInt16 (*local_48) [64];
  CLenPriceEnc *local_40;
  ulong local_38;
  
  local_ec = useLimits;
  if (p->inStream != (ISeqInStream *)0x0) {
    (p->matchFinderBase).stream = p->inStream;
    (*(p->matchFinder).Init)(p->matchFinderObj);
    p->inStream = (ISeqInStream *)0x0;
  }
  iVar31 = p->result;
  if (p->finished == 0) {
    if (iVar31 == 0) {
      if ((p->rc).res != 0) {
        p->result = 9;
      }
      if ((p->matchFinderBase).result != 0) {
        p->result = 8;
      }
      iVar31 = p->result;
      if (iVar31 != 0) {
        p->finished = 1;
      }
    }
    if (iVar31 == 0) {
      local_118 = p->nowPos64;
      if (local_118 == 0) {
        UVar9 = (*(p->matchFinder).GetNumAvailableBytes)(p->matchFinderObj);
        uVar28 = local_118;
        if (UVar9 == 0) {
          iVar31 = Flush(p,(UInt32)local_118);
          uVar28 = uVar28 & 0xffffffff;
        }
        else {
          local_220 = iVar31;
          local_160 = maxUnpackSize;
          ReadMatchDistances(p,&local_1a8);
          RangeEnc_EncodeBit(&p->rc,p->isMatch[p->state],0);
          p->state = *(UInt32 *)(kLiteralNextStates + (ulong)p->state * 4);
          bVar8 = (*(p->matchFinder).GetIndexByte)(p->matchFinderObj,-p->additionalOffset);
          pUVar3 = p->litProbs;
          uVar26 = bVar8 | 0x100;
          do {
            RangeEnc_EncodeBit(&p->rc,(UInt16 *)((ulong)(uVar26 >> 7 & 0xfffffffe) + (long)pUVar3),
                               uVar26 >> 7 & 1);
            uVar26 = uVar26 * 2;
          } while (uVar26 < 0x10000);
          p->additionalOffset = p->additionalOffset - 1;
          uVar28 = 1;
          maxUnpackSize = local_160;
          iVar31 = local_220;
        }
        if (UVar9 == 0) {
          return iVar31;
        }
      }
      else {
        uVar28 = local_118 & 0xffffffff;
      }
      UVar45 = (UInt32)uVar28;
      UVar9 = (*(p->matchFinder).GetNumAvailableBytes)(p->matchFinderObj);
      if (UVar9 != 0) {
        pUVar21 = p->reps;
        local_80 = &p->numPairs;
        local_1e8 = p->opt;
        local_1d0 = p->ProbPrices;
        local_1c0 = p->isMatch;
        local_150 = p->isRep0Long;
        local_d8 = p->opt[0].backs;
        local_130 = (p->repLenEnc).prices;
        local_98 = (p->lenEnc).prices;
        local_a8 = p->posSlotPrices;
        local_b0 = p->distancesPrices;
        local_190 = &p->rc;
        local_a0 = p->isRep;
        local_40 = &p->lenEnc;
        local_48 = p->posSlotEncoder;
        local_70 = p->posAlignEncoder;
        local_78 = p->posEncoders;
        local_c8 = p->isRepG0;
        local_d0 = p->isRepG1;
        local_60 = p->isRepG2;
        local_50 = &p->repLenEnc;
        local_88 = p->ProbPrices + 0x7d;
        local_90 = (p->repLenEnc).p.high + 0xfc;
        local_138 = p->opt + 1;
        local_188 = pUVar21;
        local_160 = maxUnpackSize;
        local_58 = (Byte *)(ulong)maxPackSize;
LAB_0019cf5f:
        uVar26 = (uint)uVar28;
        local_220 = iVar31;
        local_21c = uVar26;
        if (p->fastMode == 0) {
          uVar40 = p->optimumCurrentIndex;
          if (p->optimumEndIndex == uVar40) {
            p->optimumEndIndex = 0;
            p->optimumCurrentIndex = 0;
            if (p->additionalOffset == 0) {
              UVar9 = ReadMatchDistances(p,&local_15c);
            }
            else {
              UVar9 = p->longestMatchLength;
              local_15c = p->numPairs;
            }
            uVar40 = p->numAvail;
            if (uVar40 < 2) {
              local_22c = 0xffffffff;
LAB_0019d26c:
              uVar28 = 1;
            }
            else {
              uVar43 = 0x111;
              if (uVar40 < 0x111) {
                uVar43 = uVar40;
              }
              pBVar12 = (*(p->matchFinder).GetPointerToCurrentPos)(p->matchFinderObj);
              uVar26 = local_21c;
              iVar31 = local_220;
              bVar8 = pBVar12[-1];
              if (uVar43 < 4) {
                uVar43 = 3;
              }
              local_1a8 = (uint)*(undefined8 *)pUVar21;
              UStack_1a4 = (UInt32)((ulong)*(undefined8 *)pUVar21 >> 0x20);
              UStack_1a0 = (UInt32)*(undefined8 *)(pUVar21 + 2);
              UStack_19c = (UInt32)((ulong)*(undefined8 *)(pUVar21 + 2) >> 0x20);
              lVar19 = 0;
              uVar44 = 0;
              do {
                uVar28 = (ulong)(p->reps[lVar19] + 1);
                if ((bVar8 == pBVar12[~uVar28]) && (lVar36 = -uVar28, *pBVar12 == pBVar12[lVar36]))
                {
                  uVar28 = 2;
                  if (uVar40 != 2) {
                    uVar46 = 2;
                    do {
                      uVar28 = uVar46;
                      if (pBVar12[uVar46 - 1] != pBVar12[uVar46 + lVar36 + -1]) break;
                      uVar46 = uVar46 + 1;
                      uVar28 = (ulong)uVar43;
                    } while (uVar43 != uVar46);
                  }
                  local_e8[lVar19] = (uint)uVar28;
                  if (local_e8[uVar44] < (uint)uVar28) {
                    uVar44 = (uint)lVar19;
                  }
                }
                else {
                  local_e8[lVar19] = 0;
                }
                lVar19 = lVar19 + 1;
              } while (lVar19 != 4);
              uVar40 = local_e8[uVar44];
              uVar28 = (ulong)uVar40;
              if (uVar40 < p->numFastBytes) {
                if (UVar9 < p->numFastBytes) {
                  bVar1 = pBVar12[~(ulong)(local_1a8 + 1)];
                  if (((1 < uVar40) || (1 < UVar9)) || (bVar8 == bVar1)) {
                    pBVar35 = (Byte *)(ulong)p->state;
                    p->opt[0].state = p->state;
                    bVar2 = (byte)p->lc;
                    local_210 = (ulong)(p->pbMask & local_21c);
                    uVar44 = (uint)(local_1c0[(long)pBVar35][local_210] >> 4);
                    uVar43 = p->ProbPrices[uVar44];
                    local_218 = pBVar35;
                    if (pBVar35 < (Byte *)0x7) {
                      uVar16 = bVar8 + 0x100;
                      UVar45 = 0;
                      do {
                        UVar45 = UVar45 + local_1d0[((uint)(int)(char)uVar16 >> 7 & 0x7f0 ^
                                                    (uint)(p->litProbs +
                                                          ((uint)(pBVar12[-2] >> (8 - bVar2 & 0x1f))
                                                          + ((p->lpMask & local_21c) <<
                                                            (bVar2 & 0x1f))) * 0x300)[uVar16 >> 8])
                                                    >> 4];
                        uVar16 = uVar16 * 2;
                      } while (uVar16 < 0x10000);
                    }
                    else {
                      local_208 = CONCAT44(local_208._4_4_,uVar43);
                      local_228 = uVar28;
                      UVar45 = LitEnc_GetPriceMatched
                                         (p->litProbs +
                                          ((uint)(pBVar12[-2] >> (8 - bVar2 & 0x1f)) +
                                          ((p->lpMask & local_21c) << (bVar2 & 0x1f))) * 0x300,
                                          (uint)bVar8,(uint)bVar1,local_1d0);
                      uVar40 = (uint)local_228;
                      uVar43 = (uint)local_208;
                    }
                    pUVar3 = local_90;
                    uVar28 = local_210;
                    in_R9 = (UInt32 *)(ulong)uVar43;
                    p->opt[1].price = UVar45 + uVar43;
                    p->opt[1].backPrev = 0xffffffff;
                    p->opt[1].prev1IsChar = 0;
                    uVar16 = (uint)(p->isRep[(long)local_218] >> 4);
                    local_208 = CONCAT44(local_208._4_4_,uVar16);
                    local_228 = CONCAT44(local_228._4_4_,p->ProbPrices[uVar44 ^ 0x7f]);
                    iVar31 = *(int *)((long)p->ProbPrices + (ulong)((uVar16 ^ 0x7f) << 2)) +
                             p->ProbPrices[uVar44 ^ 0x7f];
                    if ((bVar8 == bVar1) &&
                       (uVar44 = p->ProbPrices[p->isRepG0[(long)local_218] >> 4] + iVar31 +
                                 p->ProbPrices[local_150[(long)pBVar35][local_210] >> 4],
                       uVar44 < UVar45 + uVar43)) {
                      p->opt[1].price = uVar44;
                      p->opt[1].backPrev = 0;
                      p->opt[1].prev1IsChar = 0;
                    }
                    if (uVar40 < UVar9) {
                      uVar40 = UVar9;
                    }
                    uVar46 = (ulong)uVar40;
                    if (1 < uVar40) {
                      p->opt[1].posPrev = 0;
                      uVar5 = *(undefined8 *)(local_188 + 2);
                      *(undefined8 *)local_d8 = *(undefined8 *)local_188;
                      *(undefined8 *)(local_d8 + 2) = uVar5;
                      pCVar13 = local_1e8 + uVar46;
                      uVar41 = uVar46;
                      do {
                        uVar26 = (int)uVar41 - 1;
                        uVar41 = (ulong)uVar26;
                        pCVar13->price = 0x40000000;
                        pCVar13 = pCVar13 + -1;
                      } while (1 < uVar26);
                      local_1f8 = (UInt32 *)(local_210 * 0x440);
                      lVar19 = 0;
                      do {
                        uVar41 = (ulong)local_e8[lVar19];
                        if (1 < uVar41) {
                          UVar45 = GetPureRepPrice(p,(UInt32)lVar19,(UInt32)local_218,
                                                   (UInt32)local_210);
                          pCVar13 = local_1e8 + uVar41;
                          do {
                            uVar41 = uVar41 - 1;
                            uVar26 = *(int *)(pUVar3 + uVar28 * 0x220 + uVar41 * 2 + 2) +
                                     UVar45 + iVar31;
                            if (uVar26 < pCVar13->price) {
                              pCVar13->price = uVar26;
                              pCVar13->posPrev = 0;
                              pCVar13->backPrev = (UInt32)lVar19;
                              pCVar13->prev1IsChar = 0;
                            }
                            pCVar13 = pCVar13 + -1;
                          } while ((uVar41 & 0xfffffffe) != 0);
                        }
                        lVar19 = lVar19 + 1;
                      } while (lVar19 != 4);
                      uVar28 = (ulong)(local_e8[0] + 1);
                      if (local_e8[0] < 2) {
                        uVar28 = 2;
                      }
                      uVar41 = (ulong)local_21c;
                      if ((uint)uVar28 <= UVar9) {
                        UVar9 = local_1d0[local_208 & 0xffff];
                        uVar29 = 0xfffffffe;
                        do {
                          uVar29 = (ulong)((int)uVar29 + 2);
                        } while (p->matches[uVar29] < (uint)uVar28);
                        while( true ) {
                          uVar26 = p->matches[(int)uVar29 + 1];
                          uVar40 = (uint)uVar28;
                          uVar43 = 3;
                          if (uVar40 < 5) {
                            uVar43 = uVar40 - 2;
                          }
                          if ((ulong)uVar26 < 0x80) {
                            UVar45 = local_b0[uVar43][uVar26];
                          }
                          else {
                            iVar31 = 6;
                            if (-1 < (int)(uVar26 - 0x80000)) {
                              iVar31 = 0x12;
                            }
                            UVar45 = local_a8[uVar43]
                                     [(uint)p->g_FastPos[uVar26 >> (sbyte)iVar31] + iVar31 * 2] +
                                     p->alignPrices[uVar26 & 0xf];
                          }
                          uVar43 = *(int *)((long)*local_98 +
                                           (ulong)(uVar40 - 2) * 4 + (long)local_1f8) +
                                   (uint)local_228 + UVar9 + UVar45;
                          if (uVar43 < local_1e8[uVar28].price) {
                            pCVar13 = local_1e8 + uVar28;
                            pCVar13->price = uVar43;
                            pCVar13->posPrev = 0;
                            pCVar13->backPrev = uVar26 + 4;
                            pCVar13->prev1IsChar = 0;
                          }
                          uVar26 = (int)uVar29 + 2;
                          if ((uVar40 == p->matches[uVar29]) && (uVar26 == local_15c)) break;
                          if (uVar40 == p->matches[uVar29]) {
                            uVar29 = (ulong)uVar26;
                          }
                          uVar28 = (ulong)(uVar40 + 1);
                        }
                      }
                      local_208 = 0;
                      uVar26 = 0xffe;
                      local_1f8 = (UInt32 *)0x1;
                      pCVar13 = local_1e8;
                      local_228 = uVar46;
                      local_168 = uVar41;
                      do {
                        local_1c8 = (ulong)uVar26;
                        UVar9 = (int)local_208 + 1;
                        uVar28 = (ulong)UVar9;
                        if (UVar9 == (uint)local_228) {
LAB_0019e04b:
                          local_208 = uVar28;
                          local_f4 = Backward(p,&local_22c,UVar9);
                          iVar31 = 1;
LAB_0019e065:
                          uVar26 = (uint)local_1c8;
                        }
                        else {
                          local_210 = local_208;
                          local_208 = (ulong)UVar9;
                          UVar9 = ReadMatchDistances(p,&local_1ac);
                          uVar28 = (ulong)UVar9;
                          if (p->numFastBytes <= UVar9) {
                            p->numPairs = local_1ac;
                            p->longestMatchLength = UVar9;
                            UVar9 = (UInt32)local_208;
                            uVar28 = local_208;
                            goto LAB_0019e04b;
                          }
                          uVar46 = local_208 & 0xffffffff;
                          pCVar22 = pCVar13 + uVar46;
                          uVar26 = pCVar13[uVar46].posPrev;
                          if (pCVar13[uVar46].prev1IsChar == 0) {
                            pCVar24 = &pCVar13[uVar26].state;
                          }
                          else {
                            uVar26 = uVar26 - 1;
                            if (pCVar22->prev2 == 0) {
                              pCVar24 = &pCVar13[uVar26].state;
                            }
                            else {
                              if (pCVar22->backPrev2 < 4) {
                                puVar20 = kRepNextStates;
                              }
                              else {
                                puVar20 = kMatchNextStates;
                              }
                              pCVar24 = (CState *)
                                        (puVar20 + (ulong)pCVar13[pCVar22->posPrev2].state * 4);
                            }
                            pCVar24 = (CState *)(kLiteralNextStates + (ulong)*pCVar24 * 4);
                          }
                          local_68 = uVar28;
                          if (uVar26 == (uint)local_210) {
                            if (pCVar22->backPrev == 0) {
                              puVar20 = kShortRepNextStates;
                            }
                            else {
                              puVar20 = kLiteralNextStates;
                            }
                            uVar43 = *(uint *)(puVar20 + (ulong)*pCVar24 * 4);
                          }
                          else {
                            if ((pCVar13[uVar46].prev1IsChar == 0) || (pCVar22->prev2 == 0)) {
                              uVar40 = pCVar22->backPrev;
                              if (uVar40 < 4) goto LAB_0019e111;
                              puVar20 = kMatchNextStates;
                            }
                            else {
                              uVar26 = pCVar22->posPrev2;
                              uVar40 = pCVar22->backPrev2;
LAB_0019e111:
                              puVar20 = kRepNextStates;
                            }
                            uVar43 = *(uint *)(puVar20 + (ulong)*pCVar24 * 4);
                            uVar28 = (ulong)uVar26;
                            if (uVar40 < 4) {
                              local_1a8 = local_1e8[uVar28].backs[uVar40];
                              if (uVar40 == 0) {
                                uVar26 = 1;
                              }
                              else {
                                memcpy(&UStack_1a4,local_1e8[uVar28].backs,(ulong)(uVar40 * 4));
                                uVar26 = uVar40 + 1;
                              }
                              if (uVar26 < 4) {
                                memcpy((void *)((long)&local_1a8 + (ulong)(uVar26 << 2)),
                                       (void *)((uVar28 * 0x30 | (ulong)(uVar26 << 2)) +
                                               (long)local_d8),(ulong)(2 - uVar40) * 4 + 4);
                              }
                            }
                            else {
                              local_1a8 = uVar40 - 4;
                              UStack_19c = local_1e8[uVar28].backs[2];
                              UStack_1a4 = (UInt32)*(undefined8 *)local_1e8[uVar28].backs;
                              UStack_1a0 = (UInt32)((ulong)*(undefined8 *)local_1e8[uVar28].backs >>
                                                   0x20);
                            }
                          }
                          uVar26 = local_1a8;
                          uVar40 = (int)local_168 + 1;
                          pCVar22->state = uVar43;
                          pCVar22->backs[0] = local_1a8;
                          pCVar22->backs[1] = UStack_1a4;
                          pCVar22->backs[2] = UStack_1a0;
                          pCVar22->backs[3] = UStack_19c;
                          UVar9 = pCVar22->price;
                          local_1f0 = (*(p->matchFinder).GetPointerToCurrentPos)(p->matchFinderObj);
                          local_218 = local_1f0 + -1;
                          local_170 = (ulong)(uVar26 + 1);
                          local_1fc = p->pbMask;
                          local_158 = (ulong)(local_1fc & uVar40);
                          uVar28 = (ulong)uVar43;
                          uVar26 = (uint)(local_1c0[uVar28][local_158] >> 4);
                          local_f8 = p->lc;
                          local_fc = p->lpMask;
                          UVar45 = p->ProbPrices[uVar26];
                          local_100 = 8 - local_f8;
                          local_b8 = p->litProbs;
                          bVar8 = local_1f0[-1];
                          local_1b0 = (uint)local_218[-local_170];
                          local_1dc = UVar9;
                          local_148 = (ulong)uVar40;
                          local_140 = uVar28;
                          if (uVar43 < 7) {
                            uVar43 = bVar8 + 0x100;
                            UVar10 = 0;
                            iVar31 = (int)local_210;
                            do {
                              UVar10 = UVar10 + local_1d0[((uint)(int)(char)uVar43 >> 7 & 0x7f0 ^
                                                          (uint)(local_b8 +
                                                                ((uint)(local_1f0[-2] >>
                                                                       ((byte)local_100 & 0x1f)) +
                                                                ((local_fc & uVar40) <<
                                                                ((byte)local_f8 & 0x1f))) * 0x300)
                                                                [uVar43 >> 8]) >> 4];
                              uVar43 = uVar43 * 2;
                            } while (uVar43 < 0x10000);
                          }
                          else {
                            UVar10 = LitEnc_GetPriceMatched
                                               (local_b8 +
                                                ((uint)(local_1f0[-2] >> ((byte)local_100 & 0x1f)) +
                                                ((local_fc & uVar40) << ((byte)local_f8 & 0x1f))) *
                                                0x300,(uint)bVar8,local_1b0,local_1d0);
                            iVar31 = (int)local_210;
                          }
                          uVar41 = (ulong)local_21c;
                          uVar44 = UVar45 + UVar9 + UVar10;
                          uVar40 = iVar31 + 2;
                          paUVar14 = (UInt32 (*) [272])(ulong)uVar40;
                          pCVar13 = local_1e8 + (long)paUVar14;
                          bVar47 = uVar44 < local_1e8[(long)paUVar14].price;
                          uVar43 = (uint)local_208;
                          if (bVar47) {
                            pCVar13->price = uVar44;
                            pCVar13->posPrev = uVar43;
                            pCVar13->backPrev = 0xffffffff;
                            pCVar13->prev1IsChar = 0;
                          }
                          local_210 = CONCAT44(local_210._4_4_,uVar44);
                          local_1dc = local_1dc + p->ProbPrices[uVar26 ^ 0x7f];
                          uVar16 = (uint)(p->isRep[local_140] >> 4);
                          local_1b4 = *(int *)((long)p->ProbPrices + (ulong)((uVar16 ^ 0x7f) << 2))
                                      + local_1dc;
                          if (((byte)local_1b0 == bVar8) &&
                             (((uVar43 <= pCVar13->posPrev || (pCVar13->backPrev != 0)) &&
                              (uVar26 = p->ProbPrices[p->isRepG0[local_140] >> 4] + local_1b4 +
                                        p->ProbPrices[local_150[uVar28][local_158] >> 4],
                              local_178 = paUVar14, uVar26 <= pCVar13->price)))) {
                            pCVar13->price = uVar26;
                            pCVar13->posPrev = uVar43;
                            pCVar13->backPrev = 0;
                            pCVar13->prev1IsChar = 0;
                            bVar47 = true;
                          }
                          uVar43 = p->numAvail;
                          local_180 = (ulong)uVar43;
                          uVar18 = 0xffeU - iVar31;
                          if (uVar43 <= 0xffeU - iVar31) {
                            uVar18 = uVar43;
                          }
                          iVar31 = 0x18;
                          uVar26 = (uint)local_1c8;
                          pCVar13 = local_1e8;
                          if (1 < uVar18) {
                            local_108 = p->numFastBytes;
                            local_c0 = (ulong)local_108;
                            uVar34 = local_108;
                            if (uVar18 < local_108) {
                              uVar34 = uVar18;
                            }
                            local_1d8 = CONCAT44(local_1d8._4_4_,uVar34);
                            if (!bVar47 && (byte)local_1b0 != bVar8) {
                              uVar23 = local_108 + 1;
                              uVar32 = uVar18;
                              if (uVar23 < uVar18) {
                                uVar32 = uVar23;
                              }
                              uVar17 = 1;
                              if (1 < uVar32) {
                                uVar17 = uVar26;
                                if (uVar43 < uVar26) {
                                  uVar17 = uVar43;
                                }
                                if (uVar23 <= uVar17) {
                                  uVar17 = uVar23;
                                }
                                uVar28 = local_1c8;
                                if (local_180 < local_1c8) {
                                  uVar28 = local_180;
                                }
                                if (uVar23 <= uVar28) {
                                  uVar28 = (ulong)uVar23;
                                }
                                uVar46 = 1;
                                do {
                                  if (local_1f0[uVar46 - 1] != local_1f0[uVar46 + (-1 - local_170)])
                                  {
                                    uVar17 = (uint)uVar46;
                                    break;
                                  }
                                  uVar46 = uVar46 + 1;
                                } while (uVar28 != uVar46);
                              }
                              if (1 < uVar17 - 1) {
                                uVar32 = *(uint *)(kLiteralNextStates + local_140 * 4);
                                uVar38 = (int)local_168 + 2U & local_1fc;
                                iVar31 = *(int *)((long)p->ProbPrices +
                                                 (ulong)(local_1c0[uVar32][uVar38] >> 2 & 0xfffffffc
                                                        ^ 0x1fc));
                                iVar39 = *(int *)((long)p->ProbPrices +
                                                 (ulong)(p->isRep[uVar32] >> 2 & 0xfffffffc ^ 0x1fc)
                                                 );
                                uVar23 = (uVar17 - 1) + uVar40;
                                if ((uint)local_228 < uVar23) {
                                  pCVar22 = local_138 + (local_228 & 0xffffffff);
                                  lVar19 = 0;
                                  do {
                                    pCVar22->price = 0x40000000;
                                    lVar19 = lVar19 + -1;
                                    pCVar22 = pCVar22 + 1;
                                  } while ((local_228 & 0xffffffff) -
                                           (ulong)(uVar17 + (int)local_1f8) != lVar19);
                                  local_228 = (ulong)((uint)local_228 - (int)lVar19);
                                }
                                uVar44 = iVar31 + uVar44 + iVar39 + local_130[uVar38][uVar17 - 3] +
                                         p->ProbPrices[p->isRepG0[uVar32] >> 4] +
                                         *(int *)((long)p->ProbPrices +
                                                 (ulong)(local_150[uVar32][uVar38] >> 2 & 0xfffffffc
                                                        ^ 0x1fc));
                                if (uVar44 < local_1e8[uVar23].price) {
                                  pCVar22 = local_1e8 + uVar23;
                                  pCVar22->price = uVar44;
                                  pCVar22->posPrev = uVar40;
                                  pCVar22->backPrev = 0;
                                  pCVar22->prev1IsChar = 1;
                                  pCVar22->prev2 = 0;
                                }
                              }
                            }
                            if (uVar43 < local_108) {
                              local_108 = uVar43;
                            }
                            if (uVar26 <= local_108) {
                              local_108 = uVar26;
                            }
                            local_104 = uVar26;
                            if (uVar43 < uVar26) {
                              local_104 = uVar43;
                            }
                            uVar28 = local_180;
                            if (local_c0 < local_180) {
                              uVar28 = local_c0;
                            }
                            if (local_1c8 <= uVar28) {
                              uVar28 = local_1c8;
                            }
                            local_168 = local_158 * 0x440;
                            local_178 = local_130 + local_158;
                            uVar46 = 2;
                            lVar19 = 0;
                            pBVar12 = local_1f0;
                            pBVar35 = local_218;
                            uVar29 = local_208;
                            local_1b0 = uVar18;
                            local_120 = uVar28;
                            local_10c = uVar16;
                            do {
                              pBVar42 = pBVar35 + -(ulong)((&local_1a8)[lVar19] + 1);
                              if ((*pBVar35 == *pBVar42) && (*pBVar12 == pBVar42[1])) {
                                lVar36 = -(ulong)((&local_1a8)[lVar19] + 1);
                                uVar41 = 2;
                                if (2 < uVar34) {
                                  uVar41 = 2;
                                  do {
                                    if (pBVar12[uVar41 - 1] != pBVar12[uVar41 + lVar36 + -1])
                                    goto LAB_0019e7d6;
                                    uVar41 = uVar41 + 1;
                                  } while (uVar28 != uVar41);
                                  uVar41 = (ulong)local_108;
                                }
LAB_0019e7d6:
                                iVar31 = (int)uVar41;
                                uVar26 = iVar31 + (int)uVar29;
                                local_170 = (ulong)uVar26;
                                if ((uint)local_228 < uVar26) {
                                  pCVar22 = local_138 + (local_228 & 0xffffffff);
                                  lVar25 = 0;
                                  do {
                                    pCVar22->price = 0x40000000;
                                    lVar25 = lVar25 + -1;
                                    pCVar22 = pCVar22 + 1;
                                  } while ((local_228 & 0xffffffff) -
                                           (ulong)(uint)((int)local_1f8 + iVar31) != lVar25);
                                  local_228 = (ulong)((uint)local_228 - (int)lVar25);
                                }
                                UVar45 = (UInt32)lVar19;
                                local_210 = uVar46;
                                UVar9 = GetPureRepPrice(p,UVar45,(UInt32)local_140,(UInt32)local_158
                                                       );
                                iVar39 = UVar9 + local_1b4;
                                pUVar21 = *local_178 + (iVar31 - 2U);
                                uVar28 = uVar41 & 0xffffffff;
                                do {
                                  uVar26 = *pUVar21 + iVar39;
                                  uVar40 = (int)local_1f8 + (int)uVar28;
                                  if (uVar26 < pCVar13[uVar40].price) {
                                    pCVar22 = pCVar13 + uVar40;
                                    pCVar22->price = uVar26;
                                    pCVar22->posPrev = (UInt32)local_208;
                                    pCVar22->backPrev = UVar45;
                                    pCVar22->prev1IsChar = 0;
                                  }
                                  uVar26 = (int)uVar28 - 1;
                                  uVar28 = (ulong)uVar26;
                                  pUVar21 = pUVar21 + -1;
                                } while (1 < uVar26);
                                uVar26 = iVar31 + 1;
                                uVar46 = local_210 & 0xffffffff;
                                if (lVar19 == 0) {
                                  uVar46 = (ulong)uVar26;
                                }
                                uVar43 = (int)local_c0 + iVar31 + 1;
                                uVar40 = local_1b0;
                                if (uVar43 < local_1b0) {
                                  uVar40 = uVar43;
                                }
                                uVar44 = uVar26;
                                if (uVar26 < uVar40) {
                                  uVar40 = uVar43;
                                  if (local_104 < uVar43) {
                                    uVar40 = local_104;
                                  }
                                  uVar28 = local_1c8;
                                  if (local_180 < local_1c8) {
                                    uVar28 = local_180;
                                  }
                                  uVar29 = (ulong)uVar26;
                                  if (uVar43 <= uVar28) {
                                    uVar28 = (ulong)uVar43;
                                  }
                                  do {
                                    if (local_218[uVar29] != local_218[uVar29 + lVar36])
                                    goto LAB_0019e91c;
                                    uVar29 = uVar29 + 1;
                                  } while (uVar28 != uVar29);
                                  uVar29 = (ulong)uVar40;
LAB_0019e91c:
                                  uVar44 = (uint)uVar29;
                                }
                                if (1 < uVar44 - uVar26) {
                                  local_128 = (ulong)*(uint *)(kRepNextStates + local_140 * 4);
                                  uVar40 = iVar31 + (int)local_148;
                                  UVar9 = (*local_178)[iVar31 - 2U];
                                  local_f0 = p->ProbPrices
                                             [local_1c0[local_128][uVar40 & local_1fc] >> 4];
                                  local_210 = uVar46;
                                  local_38 = (ulong)(uVar44 - uVar26);
                                  UVar10 = LitEnc_GetPriceMatched
                                                     (local_b8 +
                                                      ((uint)(local_218[iVar31 - 1] >>
                                                             ((byte)local_100 & 0x1f)) +
                                                      ((uVar40 & local_fc) <<
                                                      ((byte)local_f8 & 0x1f))) * 0x300,
                                                      (uint)local_218[uVar41 & 0xffffffff],
                                                      (uint)pBVar42[uVar41 & 0xffffffff],local_1d0);
                                  uVar26 = *(uint *)(kLiteralNextStates + local_128 * 4);
                                  uVar40 = (int)local_148 + iVar31 + 1U & local_1fc;
                                  iVar31 = *(int *)((long)p->ProbPrices +
                                                   (ulong)(local_1c0[uVar26][uVar40] >> 2 &
                                                           0xfffffffc ^ 0x1fc));
                                  iVar27 = *(int *)((long)p->ProbPrices +
                                                   (ulong)(p->isRep[uVar26] >> 2 & 0xfffffffc ^
                                                          0x1fc));
                                  uVar43 = (int)local_170 + (int)local_38 + 1;
                                  if ((uint)local_228 < uVar43) {
                                    local_128 = CONCAT44(local_128._4_4_,UVar10);
                                    pCVar13 = local_138 + (local_228 & 0xffffffff);
                                    lVar36 = 0;
                                    do {
                                      pCVar13->price = 0x40000000;
                                      lVar36 = lVar36 + -1;
                                      pCVar13 = pCVar13 + 1;
                                    } while ((local_228 & 0xffffffff) -
                                             (ulong)(uVar44 + (int)local_1f8) != lVar36);
                                    local_228 = (ulong)((uint)local_228 - (int)lVar36);
                                  }
                                  uVar26 = UVar9 + iVar39 + local_f0 + UVar10 + iVar31 + iVar27 +
                                           local_130[uVar40][(int)local_38 - 2] +
                                           p->ProbPrices[p->isRepG0[uVar26] >> 4] +
                                           *(int *)((long)p->ProbPrices +
                                                   (ulong)(local_150[uVar26][uVar40] >> 2 &
                                                           0xfffffffc ^ 0x1fc));
                                  uVar46 = local_210;
                                  if (uVar26 < local_1e8[uVar43].price) {
                                    pCVar13 = local_1e8 + uVar43;
                                    pCVar13->price = uVar26;
                                    pCVar13->posPrev = (int)local_170 + 1;
                                    pCVar13->backPrev = 0;
                                    pCVar13->prev1IsChar = 1;
                                    pCVar13->prev2 = 1;
                                    pCVar13->posPrev2 = (UInt32)local_208;
                                    pCVar13->backPrev2 = UVar45;
                                  }
                                }
                                uVar41 = (ulong)local_21c;
                                pBVar12 = local_1f0;
                                pCVar13 = local_1e8;
                                uVar28 = local_120;
                                pBVar35 = local_218;
                                uVar29 = local_208;
                                uVar34 = (uint)local_1d8;
                              }
                              lVar19 = lVar19 + 1;
                            } while (lVar19 != 4);
                            uVar26 = (uint)local_68;
                            uVar40 = uVar26;
                            if (uVar34 < uVar26) {
                              uVar28 = 0xfffffffe;
                              do {
                                iVar31 = (int)uVar28;
                                uVar28 = (ulong)(iVar31 + 2);
                              } while (p->matches[uVar28] < uVar34);
                              p->matches[uVar28] = uVar34;
                              local_1ac = iVar31 + 4;
                              uVar40 = uVar34;
                            }
                            iVar31 = 0;
                            if ((uint)uVar46 <= uVar40) {
                              local_1dc = local_1dc + local_1d0[(ushort)local_10c];
                              uVar44 = (uint)local_180;
                              uVar43 = (uint)local_1c8;
                              uVar28 = local_228;
                              if ((uint)local_228 < uVar40 + (int)uVar29) {
                                if (uVar44 <= uVar26) {
                                  uVar26 = uVar44;
                                }
                                if ((uint)local_c0 <= uVar26) {
                                  uVar26 = (uint)local_c0;
                                }
                                if (uVar43 <= uVar26) {
                                  uVar26 = uVar43;
                                }
                                pCVar22 = local_138 + (local_228 & 0xffffffff);
                                lVar19 = 0;
                                do {
                                  pCVar22->price = 0x40000000;
                                  lVar19 = lVar19 + -1;
                                  pCVar22 = pCVar22 + 1;
                                } while ((local_228 & 0xffffffff) - (ulong)(uVar26 + (int)local_1f8)
                                         != lVar19);
                                uVar28 = (ulong)((uint)local_228 - (int)lVar19);
                              }
                              uVar30 = 0xfffffffe;
                              do {
                                iVar31 = (int)uVar30;
                                uVar30 = (ulong)(iVar31 + 2);
                              } while (p->matches[uVar30] < (uint)uVar46);
                              uVar26 = p->matches[iVar31 + 3];
                              local_228 = (ulong)uVar26;
                              iVar31 = 0x12;
                              if ((int)(uVar26 - 0x80000) < 0) {
                                iVar31 = 6;
                              }
                              local_158 = CONCAT44(local_158._4_4_,
                                                   (uint)p->g_FastPos[uVar26 >> (sbyte)iVar31] +
                                                   iVar31 * 2);
                              local_1b4 = local_1ac;
                              if (uVar43 <= uVar44) {
                                local_180 = local_1c8;
                              }
                              local_180 = local_180 & 0xffffffff;
                              do {
                                uVar26 = (uint)uVar46;
                                uVar15 = (ulong)(uVar26 - 2);
                                lVar19 = uVar15 * 4;
                                if (4 < uVar26) {
                                  uVar15 = 3;
                                }
                                uVar40 = (uint)local_228;
                                if (uVar40 < 0x80) {
                                  UVar9 = local_b0[uVar15][local_228 & 0xffffffff];
                                }
                                else {
                                  UVar9 = p->alignPrices[uVar40 & 0xf] +
                                          local_a8[uVar15][local_158 & 0xffffffff];
                                }
                                uVar43 = *(int *)((long)*local_98 + lVar19 + local_168) + local_1dc
                                         + UVar9;
                                uVar15 = (ulong)(uVar26 + (UInt32)uVar29);
                                if (uVar43 < pCVar13[uVar15].price) {
                                  pCVar22 = pCVar13 + uVar15;
                                  pCVar22->price = uVar43;
                                  pCVar22->posPrev = (UInt32)uVar29;
                                  pCVar22->backPrev = uVar40 + 4;
                                  pCVar22->prev1IsChar = 0;
                                }
                                uVar37 = (ulong)(uVar26 + 1);
                                uVar16 = (uint)uVar30;
                                bVar47 = true;
                                uVar44 = uVar16;
                                if (uVar26 == p->matches[uVar30]) {
                                  uVar18 = uVar26 + 1;
                                  uVar44 = p->numFastBytes + uVar26 + 1;
                                  if (local_1b0 <= uVar44) {
                                    uVar44 = local_1b0;
                                  }
                                  local_1f0 = (Byte *)(ulong)uVar18;
                                  pBVar12 = pBVar35;
                                  if (uVar18 < uVar44) {
                                    uVar34 = p->numFastBytes + uVar26 + 1;
                                    local_1f0 = (Byte *)(ulong)uVar34;
                                    if ((uint)local_180 < uVar34) {
                                      local_1f0 = (Byte *)(local_180 & 0xffffffff);
                                    }
                                    pBVar42 = pBVar35;
                                    uVar30 = uVar37;
                                    do {
                                      pBVar12 = local_218;
                                      if (pBVar42[uVar30] != pBVar35[uVar30 - (uVar40 + 1)]) {
                                        local_1f0 = (Byte *)(uVar30 & 0xffffffff);
                                        break;
                                      }
                                      uVar30 = uVar30 + 1;
                                      pBVar42 = local_218;
                                    } while (uVar30 < uVar44);
                                  }
                                  uVar18 = (int)local_1f0 - uVar18;
                                  local_210 = uVar37;
                                  local_170 = uVar15;
                                  if (1 < uVar18) {
                                    local_1d8 = (ulong)*(uint *)(kMatchNextStates + local_140 * 4);
                                    uVar44 = uVar26 + (int)local_148;
                                    local_1fc = p->pbMask;
                                    uVar34 = local_1fc & uVar44;
                                    bVar8 = (byte)p->lc;
                                    UVar9 = p->ProbPrices[local_1c0[local_1d8][uVar34] >> 4];
                                    local_178 = (UInt32 (*) [272])(ulong)uVar18;
                                    UVar45 = LitEnc_GetPriceMatched
                                                       (local_b8 +
                                                        ((uint)(pBVar12[uVar26 - 1] >>
                                                               (8 - bVar8 & 0x1f)) +
                                                        ((uVar44 & p->lpMask) << (bVar8 & 0x1f))) *
                                                        0x300,(uint)pBVar12[uVar46 & 0xffffffff],
                                                        (uint)pBVar12[(uVar46 & 0xffffffff) -
                                                                      (ulong)(uVar40 + 1)],local_1d0
                                                       );
                                    uVar26 = *(uint *)(kLiteralNextStates + local_1d8 * 4);
                                    uVar44 = uVar34 + 1 & local_1fc;
                                    local_1fc = *(uint *)((long)p->ProbPrices +
                                                         (ulong)(local_1c0[uVar26][uVar44] >> 2 &
                                                                 0xfffffffc ^ 0x1fc));
                                    iVar31 = *(int *)((long)p->ProbPrices +
                                                     (ulong)(p->isRep[uVar26] >> 2 & 0xfffffffc ^
                                                            0x1fc));
                                    uVar40 = (int)local_178 + (int)local_170 + 1;
                                    local_1d8 = CONCAT44(local_1d8._4_4_,iVar31);
                                    if ((uint)uVar28 < uVar40) {
                                      pCVar13 = local_138 + (uVar28 & 0xffffffff);
                                      lVar19 = 0;
                                      do {
                                        pCVar13->price = 0x40000000;
                                        lVar19 = lVar19 + -1;
                                        pCVar13 = pCVar13 + 1;
                                      } while ((uVar28 & 0xffffffff) -
                                               (ulong)(uint)((int)local_1f0 + (int)local_1f8) !=
                                               lVar19);
                                      uVar28 = (ulong)((uint)uVar28 - (int)lVar19);
                                    }
                                    uVar26 = UVar9 + uVar43 + UVar45 + local_1fc + iVar31 +
                                             local_130[uVar44][(int)local_178 - 2] +
                                             p->ProbPrices[p->isRepG0[uVar26] >> 4] +
                                             *(int *)((long)p->ProbPrices +
                                                     (ulong)(local_150[uVar26][uVar44] >> 2 &
                                                             0xfffffffc ^ 0x1fc));
                                    if (uVar26 < local_1e8[uVar40].price) {
                                      pCVar13 = local_1e8 + uVar40;
                                      pCVar13->price = uVar26;
                                      pCVar13->posPrev = (int)local_170 + 1;
                                      pCVar13->backPrev = 0;
                                      pCVar13->prev1IsChar = 1;
                                      pCVar13->prev2 = 1;
                                      pCVar13->posPrev2 = (UInt32)local_208;
                                      pCVar13->backPrev2 = (int)local_228 + 4;
                                    }
                                    uVar41 = (ulong)local_21c;
                                    pCVar13 = local_1e8;
                                    pBVar12 = local_218;
                                    uVar29 = local_208;
                                  }
                                  uVar44 = uVar16 + 2;
                                  bVar47 = uVar44 != local_1b4;
                                  uVar37 = local_210;
                                  pBVar35 = pBVar12;
                                  if (bVar47) {
                                    uVar26 = p->matches[uVar16 + 3];
                                    local_228 = (ulong)uVar26;
                                    if (0x7f < local_228) {
                                      iVar31 = 0x12;
                                      if ((int)(uVar26 - 0x80000) < 0) {
                                        iVar31 = 6;
                                      }
                                      local_158 = CONCAT44(local_158._4_4_,
                                                           (uint)p->g_FastPos
                                                                 [uVar26 >> (sbyte)iVar31] +
                                                           iVar31 * 2);
                                    }
                                    bVar47 = true;
                                  }
                                }
                                uVar30 = (ulong)uVar44;
                                uVar46 = uVar37;
                              } while (bVar47);
                              local_168 = local_148;
                              uVar26 = (uint)local_1c8;
                              iVar31 = 0;
                              local_228 = uVar28;
                              goto LAB_0019e06f;
                            }
                            local_168 = local_148;
                            goto LAB_0019e065;
                          }
                          local_168 = local_148;
                        }
LAB_0019e06f:
                        if ((iVar31 != 0x18) && (iVar31 != 0)) goto LAB_0019f150;
                        uVar26 = uVar26 - 1;
                        local_1f8 = (UInt32 *)(ulong)((int)local_1f8 + 1);
                      } while( true );
                    }
                    local_22c = p->opt[1].backPrev;
                    iVar31 = local_220;
                    goto LAB_0019d26c;
                  }
                  local_22c = 0xffffffff;
                  uVar28 = 1;
                }
                else {
                  local_22c = p->matches[local_15c - 1] + 4;
                  UVar45 = UVar9 - 1;
                  if (UVar45 != 0) {
                    p->additionalOffset = p->additionalOffset + UVar45;
                    (*(p->matchFinder).Skip)(p->matchFinderObj,UVar45);
                  }
                  uVar28 = (ulong)UVar9;
                }
              }
              else {
                UVar9 = uVar40 - 1;
                local_22c = uVar44;
                if (UVar9 != 0) {
                  p->additionalOffset = p->additionalOffset + UVar9;
                  (*(p->matchFinder).Skip)(p->matchFinderObj,UVar9);
                  iVar31 = local_220;
                }
              }
            }
          }
          else {
            UVar9 = local_1e8[uVar40].posPrev;
            local_22c = local_1e8[uVar40].backPrev;
            p->optimumCurrentIndex = UVar9;
            uVar28 = (ulong)(UVar9 - uVar40);
          }
        }
        else {
          if (p->additionalOffset == 0) {
            UVar9 = ReadMatchDistances(p,&local_1a8);
            uVar46 = CONCAT44(extraout_var,UVar9);
          }
          else {
            uVar46 = (ulong)p->longestMatchLength;
            local_1a8 = p->numPairs;
          }
          uVar40 = p->numAvail;
          local_22c = 0xffffffff;
          uVar28 = 1;
          uVar26 = local_21c;
          if (1 < uVar40) {
            uVar43 = 0x111;
            if (uVar40 < 0x111) {
              uVar43 = uVar40;
            }
            local_210 = uVar46;
            pBVar12 = (*(p->matchFinder).GetPointerToCurrentPos)(p->matchFinderObj);
            if (uVar43 < 4) {
              uVar43 = 3;
            }
            uVar41 = 0;
            uVar46 = 0;
            uVar28 = 0;
            local_218 = (Byte *)CONCAT44(local_218._4_4_,uVar40);
            UVar9 = local_22c;
            do {
              bVar47 = false;
              if ((pBVar12[-1] == pBVar12[~(ulong)(pUVar21[uVar41] + 1)]) &&
                 (lVar19 = -(ulong)(pUVar21[uVar41] + 1), *pBVar12 == pBVar12[lVar19])) {
                uVar29 = 2;
                if (uVar40 != 2) {
                  uVar30 = 2;
                  do {
                    uVar29 = uVar30;
                    if (pBVar12[uVar30 - 1] != pBVar12[uVar30 + lVar19 + -1]) break;
                    uVar30 = uVar30 + 1;
                    uVar29 = (ulong)uVar43;
                  } while (uVar43 != uVar30);
                }
                uVar26 = (uint)uVar29;
                if (uVar26 < p->numFastBytes) {
                  if ((uint)uVar28 < uVar26) {
                    uVar28 = uVar29 & 0xffffffff;
                    uVar46 = uVar41 & 0xffffffff;
                  }
                  bVar47 = false;
                  pUVar21 = local_188;
                }
                else {
                  bVar47 = true;
                  UVar9 = uVar26 - 1;
                  if (UVar9 != 0) {
                    p->additionalOffset = p->additionalOffset + UVar9;
                    local_228 = CONCAT44(local_228._4_4_,(int)uVar46);
                    (*(p->matchFinder).Skip)(p->matchFinderObj,UVar9);
                    uVar46 = local_228 & 0xffffffff;
                    uVar40 = (uint)local_218;
                  }
                  in_R9 = (UInt32 *)(uVar29 & 0xffffffff);
                  pUVar21 = local_188;
                  UVar9 = (uint)uVar41;
                }
              }
              iVar31 = local_220;
              uVar26 = local_21c;
              if (bVar47) {
                uVar28 = (ulong)in_R9 & 0xffffffff;
                local_22c = UVar9;
                goto LAB_0019d4ee;
              }
              uVar41 = uVar41 + 1;
            } while (uVar41 != 4);
            uVar43 = (uint)local_210;
            uVar41 = local_210;
            if (uVar43 < p->numFastBytes) {
              UVar45 = 0;
              if (1 < uVar43) {
                uVar41 = (ulong)local_1a8;
                UVar45 = p->matches[local_1a8 - 1];
                if (2 < uVar41) {
                  pUVar33 = local_88 + uVar41;
                  uVar30 = uVar41 + 0xfffffffc;
                  uVar29 = local_210;
                  do {
                    local_1a8 = (uint)uVar41;
                    uVar44 = p->matches[uVar30 & 0xffffffff];
                    uVar43 = (uint)uVar29;
                    if ((uVar43 != uVar44 + 1) || (uVar16 = *pUVar33, UVar45 >> 7 <= uVar16)) break;
                    local_1a8 = local_1a8 - 2;
                    uVar41 = (ulong)local_1a8;
                    pUVar33 = pUVar33 + -2;
                    uVar30 = uVar30 - 2;
                    uVar29 = (ulong)uVar44;
                    UVar45 = uVar16;
                    uVar43 = uVar44;
                  } while (2 < local_1a8);
                }
                uVar41 = (ulong)uVar43;
                if (0x7f < UVar45) {
                  uVar41 = 1;
                }
                if (uVar43 != 2) {
                  uVar41 = (ulong)uVar43;
                }
              }
              local_22c = (UInt32)uVar46;
              uVar43 = (uint)uVar28;
              uVar44 = (uint)uVar41;
              if ((uVar43 < 2) ||
                 (((uVar43 + 1 < uVar44 && ((uVar43 + 2 < uVar44 || (UVar45 < 0x200)))) &&
                  ((uVar43 + 3 < uVar44 || (UVar45 < 0x8000)))))) {
                uVar28 = 1;
                local_22c = UVar9;
                if ((uVar40 != 2) && (1 < uVar44)) {
                  uVar40 = (uint)in_R9;
                  UVar9 = ReadMatchDistances(p,local_80);
                  p->longestMatchLength = UVar9;
                  if (1 < UVar9) {
                    uVar26 = p->matches[p->numPairs - 1];
                    uVar28 = 1;
                    if ((UVar9 < uVar44) || (UVar45 <= uVar26)) {
                      bVar47 = false;
                      if ((UVar9 <= uVar44 + 1) && (UVar9 != uVar44 + 1 || UVar45 < uVar26 >> 7)) {
                        bVar48 = UVar9 + 1 < uVar44;
                        bVar4 = UVar45 >> 7 <= uVar26;
                        bVar47 = bVar4 || (uVar44 < 3 || bVar48);
                        if (!bVar4 && (uVar44 >= 3 && !bVar48)) {
                          uVar40 = 1;
                        }
                        uVar28 = (ulong)uVar40;
                      }
                    }
                    else {
                      bVar47 = false;
                    }
                    uVar40 = (uint)uVar28;
                    uVar26 = local_21c;
                    if (!bVar47) goto LAB_0019d4ee;
                  }
                  pBVar12 = (*(p->matchFinder).GetPointerToCurrentPos)(p->matchFinderObj);
                  uVar43 = uVar44 - 1;
                  lVar19 = 0;
                  uVar46 = (ulong)uVar40;
                  do {
                    in_R9 = (UInt32 *)0xc;
                    uVar28 = uVar46;
                    if ((pBVar12[-1] == pBVar12[~(ulong)(pUVar21[lVar19] + 1)]) &&
                       (lVar36 = -(ulong)(pUVar21[lVar19] + 1), *pBVar12 == pBVar12[lVar36])) {
                      uVar28 = 1;
                      bVar47 = uVar43 < 3;
                      if (2 < uVar43) {
                        if (pBVar12[1] == pBVar12[lVar36 + 1]) {
                          uVar28 = 3;
                          do {
                            uVar29 = uVar28;
                            if (uVar43 == uVar29) {
                              uVar46 = 1;
                              break;
                            }
                            uVar28 = uVar29 + 1;
                          } while (pBVar12[uVar29 - 1] == pBVar12[uVar29 + lVar36 + -1]);
                          bVar47 = uVar43 <= uVar29;
                          uVar28 = uVar46;
                        }
                        else {
                          bVar47 = false;
                          uVar28 = uVar46;
                        }
                      }
                      in_R9 = (UInt32 *)(ulong)bVar47;
                    }
                    if (((int)in_R9 != 0xc) && (uVar26 = local_21c, (int)in_R9 != 0))
                    goto LAB_0019d4ee;
                    lVar19 = lVar19 + 1;
                    uVar46 = uVar28;
                  } while (lVar19 != 4);
                  UVar9 = uVar44 - 2;
                  goto joined_r0x0019d22c;
                }
              }
              else {
                UVar9 = uVar43 - 1;
                if (UVar9 != 0) {
                  p->additionalOffset = p->additionalOffset + UVar9;
                  (*(p->matchFinder).Skip)(p->matchFinderObj,UVar9);
                  uVar26 = local_21c;
                }
              }
            }
            else {
              UVar45 = p->matches[local_1a8 - 1];
              UVar9 = uVar43 - 1;
joined_r0x0019d22c:
              local_22c = UVar45 + 4;
              if (UVar9 != 0) {
                p->additionalOffset = p->additionalOffset + UVar9;
                (*(p->matchFinder).Skip)(p->matchFinderObj,UVar9);
              }
              uVar28 = uVar41 & 0xffffffff;
              uVar26 = local_21c;
            }
          }
        }
        goto LAB_0019d4ee;
      }
      goto LAB_0019f26e;
    }
  }
  return iVar31;
LAB_0019f150:
  in_R9 = local_1f8;
  uVar28 = (ulong)local_f4;
  iVar31 = local_220;
  uVar26 = (uint)uVar41;
LAB_0019d4ee:
  pCVar6 = local_190;
  UVar9 = local_22c;
  uVar40 = p->pbMask & uVar26;
  local_228 = uVar28;
  if (local_22c == 0xffffffff && (int)uVar28 == 1) {
    RangeEnc_EncodeBit(local_190,local_1c0[p->state] + uVar40,0);
    pBVar12 = (*(p->matchFinder).GetPointerToCurrentPos)(p->matchFinderObj);
    pCVar6 = local_190;
    bVar8 = (byte)p->lc;
    iVar31 = (uint)(pBVar12[-1 - (ulong)p->additionalOffset] >> (8 - bVar8 & 0x1f)) +
             ((p->lpMask & uVar26) << (bVar8 & 0x1f));
    pUVar3 = p->litProbs;
    uVar26 = (uint)pBVar12[-(ulong)p->additionalOffset];
    if (p->state < 7) {
      uVar26 = uVar26 | 0x100;
      do {
        RangeEnc_EncodeBit(pCVar6,(UInt16 *)
                                  ((long)pUVar3 +
                                  (ulong)(uVar26 >> 7 & 0x1fffffe) +
                                  (ulong)(uint)(iVar31 * 0x300) * 2),uVar26 >> 7 & 1);
        uVar26 = uVar26 * 2;
      } while (uVar26 < 0x10000);
    }
    else {
      uVar40 = (uint)(pBVar12 + -(ulong)p->additionalOffset)[~(ulong)p->reps[0]];
      uVar26 = uVar26 | 0x100;
      uVar43 = 0x100;
      do {
        uVar40 = uVar40 * 2;
        RangeEnc_EncodeBit(pCVar6,pUVar3 + (ulong)(uint)(iVar31 * 0x300) +
                                           (ulong)((uVar26 >> 8) + uVar43 + (uVar40 & uVar43)),
                           uVar26 >> 7 & 1);
        uVar26 = uVar26 * 2;
        uVar43 = uVar43 & ~(uVar26 ^ uVar40);
      } while (uVar26 < 0x10000);
    }
    p->state = *(UInt32 *)(kLiteralNextStates + (ulong)p->state * 4);
    iVar39 = (int)local_228;
    pUVar21 = local_188;
    iVar31 = local_220;
    uVar26 = local_21c;
  }
  else {
    uVar28 = (ulong)local_22c;
    RangeEnc_EncodeBit(local_190,local_1c0[p->state] + uVar40,1);
    if (UVar9 < 4) {
      RangeEnc_EncodeBit(pCVar6,local_a0 + p->state,1);
      if (uVar28 == 0) {
        iVar39 = (int)local_228;
        RangeEnc_EncodeBit(pCVar6,local_c8 + p->state,0);
        uVar26 = local_21c;
        RangeEnc_EncodeBit(pCVar6,local_150[p->state] + uVar40,(uint)(iVar39 != 1));
      }
      else {
        local_218 = (Byte *)CONCAT44(local_218._4_4_,p->reps[uVar28]);
        RangeEnc_EncodeBit(pCVar6,local_c8 + p->state,1);
        if (uVar28 == 1) {
          RangeEnc_EncodeBit(pCVar6,local_d0 + p->state,0);
        }
        else {
          RangeEnc_EncodeBit(pCVar6,local_d0 + p->state,1);
          RangeEnc_EncodeBit(pCVar6,local_60 + p->state,UVar9 - 2);
          if (uVar28 == 3) {
            p->reps[3] = p->reps[2];
          }
          p->reps[2] = p->reps[1];
        }
        iVar39 = (int)local_228;
        p->reps[1] = p->reps[0];
        p->reps[0] = (uint)local_218;
      }
      pUVar21 = local_188;
      if (iVar39 == 1) {
        uVar40 = p->state;
        puVar20 = kShortRepNextStates;
        iVar39 = 1;
      }
      else {
        in_R9 = local_1d0;
        LenEnc_Encode2(local_50,local_190,iVar39 - 2,uVar40,(uint)(p->fastMode == 0),local_1d0);
        iVar39 = (int)local_228;
        uVar40 = p->state;
        puVar20 = kRepNextStates;
      }
      p->state = *(UInt32 *)(puVar20 + (ulong)uVar40 * 4);
    }
    else {
      RangeEnc_EncodeBit(pCVar6,local_a0 + p->state,0);
      p->state = *(UInt32 *)(kMatchNextStates + (ulong)p->state * 4);
      uVar26 = (int)local_228 - 2;
      in_R9 = local_1d0;
      LenEnc_Encode2(local_40,pCVar6,uVar26,uVar40,(uint)(p->fastMode == 0),local_1d0);
      paUVar7 = local_48;
      pCVar6 = local_190;
      local_22c = UVar9 - 4;
      local_218 = (Byte *)CONCAT44(local_218._4_4_,local_22c);
      if (local_22c < 0x80) {
        uVar40 = (uint)p->g_FastPos[local_22c];
      }
      else {
        iVar31 = 0x12;
        if ((int)(UVar9 - 0x80004) < 0) {
          iVar31 = 6;
        }
        uVar40 = (uint)p->g_FastPos[local_22c >> (sbyte)iVar31] + iVar31 * 2;
      }
      if (4 < (uint)local_228) {
        uVar26 = 3;
      }
      uVar28 = 1;
      uVar43 = 5;
      do {
        bVar47 = (uVar40 >> (uVar43 & 0x1f) & 1) != 0;
        RangeEnc_EncodeBit(pCVar6,paUVar7[uVar26] + uVar28,(uint)bVar47);
        pUVar3 = local_78;
        p_00 = local_190;
        uVar28 = (ulong)((uint)bVar47 + (int)uVar28 * 2);
        bVar47 = uVar43 != 0;
        uVar43 = uVar43 - 1;
      } while (bVar47);
      if (3 < uVar40) {
        iVar31 = (uVar40 >> 1) - 1;
        uVar26 = (uVar40 & 1 | 2) << ((byte)iVar31 & 0x1f);
        uVar43 = (uint)local_218 - uVar26;
        uVar28 = (ulong)uVar43;
        if (uVar40 < 0xe) {
          uVar43 = 1;
          do {
            uVar44 = (uint)uVar28 & 1;
            RangeEnc_EncodeBit(p_00,(UInt16 *)
                                    ((long)pUVar3 +
                                    (ulong)uVar43 * 2 +
                                    ((ulong)uVar26 * 2 - (ulong)(uVar40 * 2)) + -2),uVar44);
            uVar43 = uVar44 + uVar43 * 2;
            uVar28 = uVar28 >> 1;
            iVar31 = iVar31 + -1;
          } while (iVar31 != 0);
        }
        else {
          RangeEnc_EncodeDirectBits(local_190,uVar43 >> 4,(uVar40 >> 1) - 5);
          pUVar3 = local_70;
          uVar28 = (ulong)(uVar43 & 0xf);
          uVar46 = 1;
          iVar31 = 4;
          do {
            uVar26 = (uint)uVar28 & 1;
            RangeEnc_EncodeBit(p_00,pUVar3 + uVar46,uVar26);
            uVar46 = (ulong)(uVar26 + (int)uVar46 * 2);
            uVar28 = uVar28 >> 1;
            iVar31 = iVar31 + -1;
          } while (iVar31 != 0);
          p->alignPriceCount = p->alignPriceCount + 1;
        }
      }
      p->reps[3] = p->reps[2];
      *(undefined8 *)(p->reps + 1) = *(undefined8 *)p->reps;
      p->reps[0] = (uint)local_218;
      p->matchPriceCount = p->matchPriceCount + 1;
      iVar39 = (int)local_228;
      pUVar21 = local_188;
      iVar31 = local_220;
      uVar26 = local_21c;
    }
  }
  UVar45 = uVar26 + iVar39;
  uVar28 = (ulong)UVar45;
  iVar27 = 0;
  pUVar33 = &p->additionalOffset;
  *pUVar33 = *pUVar33 - iVar39;
  if (*pUVar33 != 0) goto LAB_0019db1d;
  if (p->fastMode == 0) {
    if (0x7f < p->matchPriceCount) {
      FillDistancesPrices(p);
    }
    if (0xf < p->alignPriceCount) {
      FillAlignPrices(p);
    }
  }
  UVar9 = (*(p->matchFinder).GetNumAvailableBytes)(p->matchFinderObj);
  if (UVar9 != 0) {
    uVar26 = UVar45 - (int)local_118;
    if (local_ec == 0) {
      if (0x7fff < uVar26) {
        p->nowPos64 = p->nowPos64 + (ulong)uVar26;
        iVar31 = p->result;
        iVar27 = 1;
        if (iVar31 == 0) {
          if ((p->rc).res != 0) {
            p->result = 9;
          }
          if ((p->matchFinderBase).result != 0) {
            p->result = 8;
          }
          iVar31 = p->result;
          if (iVar31 != 0) {
            p->finished = 1;
          }
        }
      }
      goto LAB_0019db1d;
    }
    if ((uVar26 + 0x112c < local_160) &&
       ((p->rc).buf + (p->rc).cacheSize + ((p->rc).processed - (long)(p->rc).bufBase) + 0x2000 <
        local_58)) goto LAB_0019db1d;
  }
  iVar27 = 2;
LAB_0019db1d:
  if (iVar27 != 0) goto LAB_0019f261;
  goto LAB_0019cf5f;
LAB_0019f261:
  if (iVar27 != 2) {
    return iVar31;
  }
LAB_0019f26e:
  p->nowPos64 = p->nowPos64 + (ulong)(UVar45 - (int)local_118);
  SVar11 = Flush(p,UVar45);
  return SVar11;
}

Assistant:

static SRes LzmaEnc_CodeOneBlock(CLzmaEnc* p, Bool useLimits, UInt32 maxPackSize, UInt32 maxUnpackSize) {
  UInt32 nowPos32, startPos32;
  if (p->inStream != 0) {
    p->matchFinderBase.stream = p->inStream;
    p->matchFinder.Init(p->matchFinderObj);
    p->inStream = 0;
  }

  if (p->finished)
    return p->result;
  RINOK(CheckErrors(p));

  nowPos32 = (UInt32)p->nowPos64;
  startPos32 = nowPos32;

  if (p->nowPos64 == 0) {
    UInt32 numPairs;
    Byte curByte;
    if (p->matchFinder.GetNumAvailableBytes(p->matchFinderObj) == 0)
      return Flush(p, nowPos32);
    ReadMatchDistances(p, &numPairs);
    RangeEnc_EncodeBit(&p->rc, &p->isMatch[p->state][0], 0);
    p->state = kLiteralNextStates[p->state];
    curByte = p->matchFinder.GetIndexByte(p->matchFinderObj, 0 - p->additionalOffset);
    LitEnc_Encode(&p->rc, p->litProbs, curByte);
    p->additionalOffset--;
    nowPos32++;
  }

  if (p->matchFinder.GetNumAvailableBytes(p->matchFinderObj) != 0)
    for (;;) {
      UInt32 pos, len, posState;

      if (p->fastMode)
        len = GetOptimumFast(p, &pos);
      else
        len = GetOptimum(p, nowPos32, &pos);

#ifdef SHOW_STAT2
      printf("\n pos = %4X,   len = %d   pos = %d", nowPos32, len, pos);
#endif

      posState = nowPos32 & p->pbMask;
      if (len == 1 && pos == (UInt32)-1) {
        Byte curByte;
        CLzmaProb* probs;
        const Byte* data;

        RangeEnc_EncodeBit(&p->rc, &p->isMatch[p->state][posState], 0);
        data = p->matchFinder.GetPointerToCurrentPos(p->matchFinderObj) - p->additionalOffset;
        curByte = *data;
        probs = LIT_PROBS(nowPos32, *(data - 1));
        if (IsCharState(p->state))
          LitEnc_Encode(&p->rc, probs, curByte);
        else
          LitEnc_EncodeMatched(&p->rc, probs, curByte, *(data - p->reps[0] - 1));
        p->state = kLiteralNextStates[p->state];
      } else {
        RangeEnc_EncodeBit(&p->rc, &p->isMatch[p->state][posState], 1);
        if (pos < LZMA_NUM_REPS) {
          RangeEnc_EncodeBit(&p->rc, &p->isRep[p->state], 1);
          if (pos == 0) {
            RangeEnc_EncodeBit(&p->rc, &p->isRepG0[p->state], 0);
            RangeEnc_EncodeBit(&p->rc, &p->isRep0Long[p->state][posState], ((len == 1) ? 0 : 1));
          } else {
            UInt32 distance = p->reps[pos];
            RangeEnc_EncodeBit(&p->rc, &p->isRepG0[p->state], 1);
            if (pos == 1)
              RangeEnc_EncodeBit(&p->rc, &p->isRepG1[p->state], 0);
            else {
              RangeEnc_EncodeBit(&p->rc, &p->isRepG1[p->state], 1);
              RangeEnc_EncodeBit(&p->rc, &p->isRepG2[p->state], pos - 2);
              if (pos == 3)
                p->reps[3] = p->reps[2];
              p->reps[2] = p->reps[1];
            }
            p->reps[1] = p->reps[0];
            p->reps[0] = distance;
          }
          if (len == 1)
            p->state = kShortRepNextStates[p->state];
          else {
            LenEnc_Encode2(&p->repLenEnc, &p->rc, len - LZMA_MATCH_LEN_MIN, posState, !p->fastMode, p->ProbPrices);
            p->state = kRepNextStates[p->state];
          }
        } else {
          UInt32 posSlot;
          RangeEnc_EncodeBit(&p->rc, &p->isRep[p->state], 0);
          p->state = kMatchNextStates[p->state];
          LenEnc_Encode2(&p->lenEnc, &p->rc, len - LZMA_MATCH_LEN_MIN, posState, !p->fastMode, p->ProbPrices);
          pos -= LZMA_NUM_REPS;
          GetPosSlot(pos, posSlot);
          RcTree_Encode(&p->rc, p->posSlotEncoder[GetLenToPosState(len)], kNumPosSlotBits, posSlot);

          if (posSlot >= kStartPosModelIndex) {
            UInt32 footerBits = ((posSlot >> 1) - 1);
            UInt32 base = ((2 | (posSlot & 1)) << footerBits);
            UInt32 posReduced = pos - base;

            if (posSlot < kEndPosModelIndex)
              RcTree_ReverseEncode(&p->rc, p->posEncoders + base - posSlot - 1, footerBits, posReduced);
            else {
              RangeEnc_EncodeDirectBits(&p->rc, posReduced >> kNumAlignBits, footerBits - kNumAlignBits);
              RcTree_ReverseEncode(&p->rc, p->posAlignEncoder, kNumAlignBits, posReduced & kAlignMask);
              p->alignPriceCount++;
            }
          }
          p->reps[3] = p->reps[2];
          p->reps[2] = p->reps[1];
          p->reps[1] = p->reps[0];
          p->reps[0] = pos;
          p->matchPriceCount++;
        }
      }
      p->additionalOffset -= len;
      nowPos32 += len;
      if (p->additionalOffset == 0) {
        UInt32 processed;
        if (!p->fastMode) {
          if (p->matchPriceCount >= (1 << 7))
            FillDistancesPrices(p);
          if (p->alignPriceCount >= kAlignTableSize)
            FillAlignPrices(p);
        }
        if (p->matchFinder.GetNumAvailableBytes(p->matchFinderObj) == 0)
          break;
        processed = nowPos32 - startPos32;
        if (useLimits) {
          if (processed + kNumOpts + 300 >= maxUnpackSize ||
              RangeEnc_GetProcessed(&p->rc) + kNumOpts * 2 >= maxPackSize)
            break;
        } else if (processed >= (1 << 15)) {
          p->nowPos64 += nowPos32 - startPos32;
          return CheckErrors(p);
        }
      }
    }
  p->nowPos64 += nowPos32 - startPos32;
  return Flush(p, nowPos32);
}